

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

ON_SubDComponentPtr __thiscall ON_SubDComponentPtr::NextComponent(ON_SubDComponentPtr *this)

{
  uint uVar1;
  ulong uVar2;
  ON_SubDComponentPtr OVar3;
  ON_SubDFace *f;
  ON_SubDEdge *e;
  ON_SubDVertex *v;
  ON_SubDComponentPtr *this_local;
  
  uVar1 = (uint)this->m_ptr & 6;
  if (uVar1 == 2) {
    uVar2 = this->m_ptr & 0xfffffffffffffff8;
    if (uVar2 != 0) {
      OVar3 = Create(*(ON_SubDVertex **)(uVar2 + 0x58));
      return (ON_SubDComponentPtr)OVar3.m_ptr;
    }
  }
  else if (uVar1 != 4) {
    if (uVar1 != 6) {
      return (ON_SubDComponentPtr)0;
    }
    goto LAB_008844a9;
  }
  uVar2 = this->m_ptr & 0xfffffffffffffff8;
  if (uVar2 != 0) {
    OVar3 = Create(*(ON_SubDEdge **)(uVar2 + 0x58));
    return (ON_SubDComponentPtr)OVar3.m_ptr;
  }
LAB_008844a9:
  uVar2 = this->m_ptr & 0xfffffffffffffff8;
  if (uVar2 == 0) {
    return (ON_SubDComponentPtr)0;
  }
  OVar3 = Create(*(ON_SubDFace **)(uVar2 + 0x58));
  return (ON_SubDComponentPtr)OVar3.m_ptr;
}

Assistant:

const ON_SubDComponentPtr ON_SubDComponentPtr::NextComponent() const
{
  switch (ON_SUBD_COMPONENT_TYPE_MASK & m_ptr)
  {
  case ON_SUBD_COMPONENT_TYPE_VERTEX:
  {
    const ON_SubDVertex* v = ON_SUBD_VERTEX_POINTER(m_ptr);
    if (nullptr != v)
      return ON_SubDComponentPtr::Create(v->m_next_vertex);
  }
  case ON_SUBD_COMPONENT_TYPE_EDGE:
  {
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(m_ptr);
    if (nullptr != e)
      return ON_SubDComponentPtr::Create(e->m_next_edge);
  }
  case ON_SUBD_COMPONENT_TYPE_FACE:
  {
    const ON_SubDFace* f = ON_SUBD_FACE_POINTER(m_ptr);
    if (nullptr != f)
      return ON_SubDComponentPtr::Create(f->m_next_face);
  }
  default:
    break;
  }
  return ON_SubDComponentPtr::Null;
}